

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msghash32)

{
  byte bVar1;
  undefined4 extraout_EAX;
  int iVar2;
  secp256k1_fe *b;
  void *pvVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_fe fx;
  secp256k1_ge x;
  secp256k1_scalar m;
  uchar brx [32];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_ge q;
  secp256k1_gej xj;
  secp256k1_gej qj;
  
  if (msghash32 == (uchar *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "msghash32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "signature != NULL";
  }
  else {
    if (pubkey != (secp256k1_pubkey *)0x0) {
      r.d[0] = *(uint64_t *)signature->data;
      r.d[1] = *(uint64_t *)(signature->data + 8);
      r.d[2] = *(uint64_t *)(signature->data + 0x10);
      r.d[3] = *(uint64_t *)(signature->data + 0x18);
      s.d[0] = *(uint64_t *)(signature->data + 0x20);
      s.d[1] = *(uint64_t *)(signature->data + 0x28);
      s.d[2] = *(uint64_t *)(signature->data + 0x30);
      s.d[3] = *(uint64_t *)(signature->data + 0x38);
      bVar1 = signature->data[0x40];
      secp256k1_scalar_set_b32(&m,msghash32,(int *)0x0);
      auVar5._0_4_ = -(uint)((int)r.d[0] == 0 && (int)r.d[2] == 0);
      auVar5._4_4_ = -(uint)(r.d[0]._4_4_ == 0 && r.d[2]._4_4_ == 0);
      auVar5._8_4_ = -(uint)((int)r.d[1] == 0 && (int)r.d[3] == 0);
      auVar5._12_4_ = -(uint)(r.d[1]._4_4_ == 0 && r.d[3]._4_4_ == 0);
      iVar2 = movmskps(extraout_EAX,auVar5);
      if ((iVar2 != 0xf) && ((s.d[1] != 0 || s.d[3] != 0) || (s.d[0] != 0 || s.d[2] != 0))) {
        b = (secp256k1_fe *)brx;
        secp256k1_scalar_get_b32((uchar *)b,&r);
        secp256k1_fe_impl_set_b32_limit(&fx,(uchar *)b);
        if ((bVar1 & 2) != 0) {
          iVar2 = secp256k1_fe_impl_cmp_var(&fx,b);
          if (-1 < iVar2) goto LAB_00946266;
          secp256k1_fe_impl_add(&fx,&secp256k1_ecdsa_const_order_as_fe);
        }
        iVar2 = secp256k1_ge_set_xo_var(&x,&fx,bVar1 & 1);
        if (iVar2 != 0) {
          xj.infinity = x.infinity;
          xj.x.n[0] = x.x.n[0];
          xj.x.n[1] = x.x.n[1];
          xj.x.n[2] = x.x.n[2];
          xj.x.n[3] = x.x.n[3];
          xj.x.n[4] = x.x.n[4];
          xj.y.n[0] = x.y.n[0];
          xj.y.n[1] = x.y.n[1];
          xj.y.n[2] = x.y.n[2];
          xj.y.n[3] = x.y.n[3];
          xj.y.n[4] = x.y.n[4];
          xj.z.n[0] = 1;
          xj.z.n[1] = 0;
          xj.z.n[2] = 0;
          xj.z.n[3] = 0;
          xj.z.n[4] = 0;
          secp256k1_scalar_inverse_var(&rn,&r);
          secp256k1_scalar_mul(&u1,&rn,&m);
          secp256k1_scalar_negate(&u1,&u1);
          secp256k1_scalar_mul(&u2,&rn,&s);
          secp256k1_ecmult(&qj,&xj,&u2,&u1);
          secp256k1_ge_set_gej_var(&q,&qj);
          if (qj.infinity == 0) {
            secp256k1_pubkey_save(pubkey,&q);
            return 1;
          }
        }
      }
LAB_00946266:
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      return 0;
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    if (secp256k1_ecdsa_sig_recover(&r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}